

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O0

Abc_Obj_t * Abc_NtkBddFindCofactor(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pNode,int nLutSize)

{
  DdManager *dd;
  DdManager *ddDestination;
  int iVar1;
  uint uVar2;
  DdNode *pDVar3;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pAVar4;
  DdNode *pDVar5;
  DdNode *g;
  DdNode *local_118;
  DdNode *local_108;
  DdNode *local_d0;
  DdNode *local_a8;
  int local_90;
  int local_8c;
  int fCof1Smaller;
  int iFreeVar;
  int iCof;
  int i;
  DdNode *bCof1n;
  DdNode *bCof0n;
  DdNode *bVar;
  DdNode *bTemp;
  DdNode *bSupp;
  DdNode *bCof1;
  DdNode *bCof0;
  DdManager *ddNew;
  DdManager *ddOld;
  Abc_Obj_t *pNodeTop;
  Abc_Obj_t *pNodeBot;
  int nLutSize_local;
  Abc_Obj_t *pNode_local;
  Abc_Ntk_t *pNtkNew_local;
  
  dd = (DdManager *)pNode->pNtk->pManFunc;
  ddDestination = (DdManager *)pNtkNew->pManFunc;
  bCof1 = (DdNode *)0x0;
  bSupp = (DdNode *)0x0;
  local_90 = -1;
  iVar1 = Abc_ObjFaninNum(pNode);
  if (iVar1 != nLutSize + 1) {
    __assert_fail("Abc_ObjFaninNum(pNode) == nLutSize + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcLutmin.c"
                  ,0x1fd,"Abc_Obj_t *Abc_NtkBddFindCofactor(Abc_Ntk_t *, Abc_Obj_t *, int)");
  }
  for (fCof1Smaller = 0; iVar1 = Abc_ObjFaninNum(pNode), fCof1Smaller < iVar1;
      fCof1Smaller = fCof1Smaller + 1) {
    pDVar3 = Cudd_bddIthVar(dd,fCof1Smaller);
    bCof1 = Cudd_Cofactor(dd,(DdNode *)(pNode->field_5).pData,(DdNode *)((ulong)pDVar3 ^ 1));
    Cudd_Ref(bCof1);
    bSupp = Cudd_Cofactor(dd,(DdNode *)(pNode->field_5).pData,pDVar3);
    Cudd_Ref(bSupp);
    iVar1 = Cudd_SupportSize(dd,bCof1);
    if (iVar1 <= nLutSize + -2) {
      local_90 = 0;
      break;
    }
    iVar1 = Cudd_SupportSize(dd,bSupp);
    if (iVar1 <= nLutSize + -2) {
      local_90 = 1;
      break;
    }
    Cudd_RecursiveDeref(dd,bCof1);
    Cudd_RecursiveDeref(dd,bSupp);
  }
  iVar1 = Abc_ObjFaninNum(pNode);
  if (fCof1Smaller == iVar1) {
    pNtkNew_local = (Abc_Ntk_t *)0x0;
  }
  else {
    if (local_90 == 0) {
      local_a8 = bCof1;
    }
    else {
      local_a8 = bSupp;
    }
    pDVar3 = Cudd_Support(dd,local_a8);
    Cudd_Ref(pDVar3);
    local_8c = -1;
    for (iFreeVar = 0; iVar1 = Abc_ObjFaninNum(pNode), iFreeVar < iVar1; iFreeVar = iFreeVar + 1) {
      iVar1 = Cudd_ReadPerm(dd,iFreeVar);
      if (iFreeVar != iVar1) {
        __assert_fail("i == Cudd_ReadPerm(ddOld, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcLutmin.c"
                      ,0x217,"Abc_Obj_t *Abc_NtkBddFindCofactor(Abc_Ntk_t *, Abc_Obj_t *, int)");
      }
      bVar = pDVar3;
      if (iFreeVar != fCof1Smaller) {
        while ((*(int *)((ulong)bVar & 0xfffffffffffffffe) != 0x7fffffff &&
               (uVar2 = Cudd_NodeReadIndex(bVar), iFreeVar != uVar2))) {
          bVar = (bVar->type).kids.T;
        }
        if (*(int *)((ulong)bVar & 0xfffffffffffffffe) == 0x7fffffff) {
          local_8c = iFreeVar;
          break;
        }
      }
    }
    if ((local_8c == fCof1Smaller) || (iVar1 = Abc_ObjFaninNum(pNode), iVar1 <= local_8c)) {
      __assert_fail("iFreeVar != iCof && iFreeVar < Abc_ObjFaninNum(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcLutmin.c"
                    ,0x223,"Abc_Obj_t *Abc_NtkBddFindCofactor(Abc_Ntk_t *, Abc_Obj_t *, int)");
    }
    Cudd_RecursiveDeref(dd,pDVar3);
    local_118 = Extra_TransferLevelByLevel(dd,ddDestination,bCof1);
    Cudd_Ref(local_118);
    pDVar3 = Extra_TransferLevelByLevel(dd,ddDestination,bSupp);
    Cudd_Ref(pDVar3);
    Cudd_RecursiveDeref(dd,bCof1);
    Cudd_RecursiveDeref(dd,bSupp);
    pFanin = Abc_NtkCreateNode(pNtkNew);
    for (iFreeVar = 0; iVar1 = Abc_ObjFaninNum(pNode), iFreeVar < iVar1; iFreeVar = iFreeVar + 1) {
      pAVar4 = Abc_ObjFanin(pNode,iFreeVar);
      Abc_ObjAddFanin(pFanin,(pAVar4->field_6).pCopy);
    }
    local_d0 = pDVar3;
    if (local_90 != 0) {
      local_d0 = local_118;
    }
    (pFanin->field_5).pData = local_d0;
    pNtkNew_local = (Abc_Ntk_t *)Abc_NtkCreateNode(pNtkNew);
    for (iFreeVar = 0; iVar1 = Abc_ObjFaninNum(pNode), iFreeVar < iVar1; iFreeVar = iFreeVar + 1) {
      if (iFreeVar == local_8c) {
        Abc_ObjAddFanin((Abc_Obj_t *)pNtkNew_local,pFanin);
      }
      else {
        pAVar4 = Abc_ObjFanin(pNode,iFreeVar);
        Abc_ObjAddFanin((Abc_Obj_t *)pNtkNew_local,(pAVar4->field_6).pCopy);
      }
    }
    pDVar5 = Cudd_bddIthVar(ddDestination,fCof1Smaller);
    if (local_90 == 0) {
      g = Cudd_bddIthVar(ddDestination,local_8c);
      local_108 = local_118;
    }
    else {
      local_108 = Cudd_bddIthVar(ddDestination,local_8c);
      g = pDVar3;
    }
    pDVar5 = Cudd_bddIte(ddDestination,pDVar5,g,local_108);
    ((anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)&pNtkNew_local->vCis)->pData = pDVar5;
    Cudd_Ref((DdNode *)((anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)&pNtkNew_local->vCis)->pData);
    if (local_90 != 0) {
      local_118 = pDVar3;
    }
    Cudd_RecursiveDeref(ddDestination,local_118);
  }
  return (Abc_Obj_t *)pNtkNew_local;
}

Assistant:

Abc_Obj_t * Abc_NtkBddFindCofactor( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pNode, int nLutSize )
{
    Abc_Obj_t * pNodeBot, * pNodeTop;
    DdManager * ddOld = (DdManager *)pNode->pNtk->pManFunc;
    DdManager * ddNew = (DdManager *)pNtkNew->pManFunc;
    DdNode * bCof0 = NULL, * bCof1 = NULL, * bSupp, * bTemp, * bVar;
    DdNode * bCof0n, * bCof1n;
    int i, iCof, iFreeVar, fCof1Smaller = -1;
    assert( Abc_ObjFaninNum(pNode) == nLutSize + 1 );
    for ( iCof = 0; iCof < Abc_ObjFaninNum(pNode); iCof++ )
    {
        bVar  = Cudd_bddIthVar( ddOld, iCof );
        bCof0 = Cudd_Cofactor( ddOld, (DdNode *)pNode->pData, Cudd_Not(bVar) );  Cudd_Ref( bCof0 );
        bCof1 = Cudd_Cofactor( ddOld, (DdNode *)pNode->pData, bVar  );           Cudd_Ref( bCof1 );
        if ( Cudd_SupportSize( ddOld, bCof0 ) <= nLutSize - 2 )
        {
            fCof1Smaller = 0;
            break;
        }
        if ( Cudd_SupportSize( ddOld, bCof1 ) <= nLutSize - 2 )
        {
            fCof1Smaller = 1;
            break;
        }
        Cudd_RecursiveDeref( ddOld, bCof0 );
        Cudd_RecursiveDeref( ddOld, bCof1 );
    }
    if ( iCof == Abc_ObjFaninNum(pNode) )
        return NULL;
    // find unused variable
    bSupp = Cudd_Support( ddOld, fCof1Smaller? bCof1 : bCof0 );   Cudd_Ref( bSupp );
    iFreeVar = -1;
    for ( i = 0; i < Abc_ObjFaninNum(pNode); i++ )
    {
        assert( i == Cudd_ReadPerm(ddOld, i) );
        if ( i == iCof )
            continue;
        for ( bTemp = bSupp; !Cudd_IsConstant(bTemp); bTemp = cuddT(bTemp) )
            if ( i == (int)Cudd_NodeReadIndex(bTemp) )
                break;
        if ( Cudd_IsConstant(bTemp) )
        {
            iFreeVar = i;
            break;
        }
    }
    assert( iFreeVar != iCof && iFreeVar < Abc_ObjFaninNum(pNode) );
    Cudd_RecursiveDeref( ddOld, bSupp );
    // transfer the cofactors
    bCof0n = Extra_TransferLevelByLevel( ddOld, ddNew, bCof0 ); Cudd_Ref( bCof0n );
    bCof1n = Extra_TransferLevelByLevel( ddOld, ddNew, bCof1 ); Cudd_Ref( bCof1n );
    Cudd_RecursiveDeref( ddOld, bCof0 );
    Cudd_RecursiveDeref( ddOld, bCof1 );
    // create bottom node
    pNodeBot = Abc_NtkCreateNode( pNtkNew );
    for ( i = 0; i < Abc_ObjFaninNum(pNode); i++ )
        Abc_ObjAddFanin( pNodeBot, Abc_ObjFanin(pNode, i)->pCopy );
    pNodeBot->pData = fCof1Smaller? bCof0n : bCof1n;
    // create top node
    pNodeTop = Abc_NtkCreateNode( pNtkNew );
    for ( i = 0; i < Abc_ObjFaninNum(pNode); i++ )
        if ( i == iFreeVar )           
            Abc_ObjAddFanin( pNodeTop, pNodeBot );
        else
            Abc_ObjAddFanin( pNodeTop, Abc_ObjFanin(pNode, i)->pCopy );
    // derive the new function
    pNodeTop->pData = Cudd_bddIte( ddNew, 
        Cudd_bddIthVar(ddNew, iCof), 
        fCof1Smaller? bCof1n : Cudd_bddIthVar(ddNew, iFreeVar), 
        fCof1Smaller? Cudd_bddIthVar(ddNew, iFreeVar) : bCof0n );
    Cudd_Ref( (DdNode *)pNodeTop->pData );
    Cudd_RecursiveDeref( ddNew, fCof1Smaller? bCof1n : bCof0n );
    return pNodeTop;
}